

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

_tExecReaction __thiscall yactfr::internal::Vm::_execReadFlBitArrayBeRev(Vm *this,Instr *instr)

{
  Instr *instr_local;
  Vm *this_local;
  
  _execReadFlBitArray<yactfr::internal::(anonymous_namespace)::readFlUIntBeFuncs,_true>(this,instr);
  return FetchNextInstrAndStop;
}

Assistant:

Vm::_tExecReaction Vm::_execReadFlBitArrayBeRev(const Instr& instr)
{
    this->_execReadFlBitArray<readFlUIntBeFuncs, true>(instr);
    return _tExecReaction::FetchNextInstrAndStop;
}